

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamToolsIndex::InitializeFileSummary(BamToolsIndex *this,int *numReferences)

{
  pointer *ppBVar1;
  pointer pBVar2;
  iterator __position;
  int iVar3;
  BtiReferenceSummary local_38;
  
  pBVar2 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  if (0 < *numReferences) {
    iVar3 = 0;
    do {
      local_38.NumBlocks = 0;
      local_38.FirstBlockFilePosition = 0;
      __position._M_current =
           (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_indexFileSummary).
          super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
        ::_M_realloc_insert<BamTools::Internal::BtiReferenceSummary>
                  (&this->m_indexFileSummary,__position,&local_38);
      }
      else {
        *(ulong *)__position._M_current = (ulong)(uint)local_38._4_4_ << 0x20;
        (__position._M_current)->FirstBlockFilePosition = 0;
        ppBVar1 = &(this->m_indexFileSummary).
                   super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < *numReferences);
  }
  return;
}

Assistant:

void BamToolsIndex::InitializeFileSummary(const int& numReferences) {
    m_indexFileSummary.clear();
    for ( int i = 0; i < numReferences; ++i )
        m_indexFileSummary.push_back( BtiReferenceSummary() );
}